

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void ngai_elem2_patch_(Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,
                      Integer g_c,Integer *clo,Integer *chi,int op)

{
  int iVar1;
  long lVar2;
  Integer IVar3;
  Integer IVar4;
  logical lVar5;
  Integer IVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  char notrans;
  long local_cc0;
  char *C_ptr;
  char *B_ptr;
  Integer g_A;
  Integer g_B;
  char *A_ptr;
  Integer bndim;
  Integer andim;
  Integer local_c80;
  Integer local_c78;
  long local_c70;
  Integer local_c68;
  int local_c5c;
  Integer ctype;
  Integer atype;
  Integer loC [7];
  Integer hiC [7];
  Integer btype;
  int lod [7];
  Integer hiB [7];
  Integer loB [7];
  Integer hiA [7];
  Integer loA [7];
  Integer ldC [7];
  Integer ldB [7];
  Integer ldA [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_a;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_c;
  
  g_A = g_a;
  g_B = g_b;
  local_c80 = g_a;
  local_c78 = g_b;
  local_c68 = pnga_nodeid();
  notrans = 'n';
  bVar10 = _ga_sync_begin != 0;
  local_c5c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar10) {
    pnga_sync();
  }
  IVar6 = local_c80;
  pnga_check_handle(local_c80,"gai_elem2_patch_");
  pnga_inquire(IVar6,&atype,&andim,adims);
  pnga_inquire(local_c78,&btype,&bndim,bdims);
  pnga_inquire(g_c,&ctype,&local_cc0,cdims);
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  for (lVar8 = 0; lVar8 < andim; lVar8 = lVar8 + 1) {
    if ((alo[lVar8] < 1) || (adims[lVar8] < ahi[lVar8])) {
      pnga_error("g_a indices out of range ",local_c80);
    }
  }
  for (lVar8 = 0; lVar8 < bndim; lVar8 = lVar8 + 1) {
    if ((blo[lVar8] < 1) || (bdims[lVar8] < bhi[lVar8])) {
      pnga_error("g_b indices out of range ",local_c78);
    }
  }
  for (lVar8 = 0; lVar8 < local_cc0; lVar8 = lVar8 + 1) {
    if ((clo[lVar8] < 1) || (cdims[lVar8] < chi[lVar8])) {
      pnga_error("g_c indices out of range ",g_c);
    }
  }
  lVar7 = 0;
  lVar8 = local_cc0;
  if (local_cc0 < 1) {
    lVar8 = lVar7;
  }
  lVar2 = 1;
  for (; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    lVar2 = lVar2 * ((chi[lVar7] - clo[lVar7]) + 1);
  }
  lVar8 = 0;
  IVar6 = andim;
  if (andim < 1) {
    IVar6 = lVar8;
  }
  lVar7 = 1;
  for (; IVar6 != lVar8; lVar8 = lVar8 + 1) {
    lVar7 = lVar7 * ((ahi[lVar8] - alo[lVar8]) + 1);
  }
  lVar8 = 0;
  IVar6 = bndim;
  if (bndim < 1) {
    IVar6 = lVar8;
  }
  lVar9 = 1;
  for (; IVar6 != lVar8; lVar8 = lVar8 + 1) {
    lVar9 = lVar9 * ((bhi[lVar8] - blo[lVar8]) + 1);
  }
  if ((lVar7 != lVar2) || (lVar9 != lVar2)) {
    pnga_error("  capacities of patches do not match ",0);
  }
  IVar3 = pnga_total_blocks(local_c80);
  local_c70 = pnga_total_blocks(local_c78);
  IVar4 = pnga_total_blocks(g_c);
  IVar6 = local_c68;
  if (((IVar3 < 0) && (local_c70 < 0)) && (IVar4 < 0)) {
    pnga_distribution(g_A,local_c68,loA,hiA);
    pnga_distribution(g_B,IVar6,loB,hiB);
    pnga_distribution(g_c,IVar6,loC,hiC);
    lVar5 = pnga_comp_patch(andim,loA,hiA,local_cc0,loC,hiC);
    if ((lVar5 == 0) || (lVar5 = pnga_comp_patch(andim,alo,ahi,local_cc0,clo,chi), lVar5 == 0)) {
      hdl_a.g_a = 0;
    }
    else {
      hdl_a.g_a = 1;
    }
    IVar6 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar6,&hdl_a,1,"&&");
    local_c70 = CONCAT71(local_c70._1_7_,1);
    if (hdl_a.g_a == 0) {
      local_c70 = CONCAT71(local_c70._1_7_,local_c78 != g_c);
      if (local_c78 == g_c) {
        lVar5 = pnga_duplicate(local_c78,&g_A,"temp");
        if (lVar5 == 0) {
          pnga_error("ga_dadd_patch: dup failed",0);
        }
        pnga_copy_patch(&notrans,local_c80,alo,ahi,g_A,clo,chi);
      }
      else {
        pnga_copy_patch(&notrans,local_c80,alo,ahi,g_c,clo,chi);
        g_A = g_c;
      }
      andim = local_cc0;
      pnga_distribution(g_A,local_c68,loA,hiA);
    }
    lVar5 = pnga_comp_patch(bndim,loB,hiB,local_cc0,loC,hiC);
    IVar6 = 1;
    if ((lVar5 == 0) || (lVar5 = pnga_comp_patch(bndim,blo,bhi,local_cc0,clo,chi), lVar5 == 0)) {
      IVar6 = 0;
    }
    hdl_a.g_a = IVar6;
    IVar6 = pnga_type_f2c(0x3f2);
    bVar10 = true;
    pnga_gop(IVar6,&hdl_a,1,"&&");
    if (hdl_a.g_a == 0) {
      lVar5 = pnga_duplicate(g_c,&g_B,"temp");
      if (lVar5 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&notrans,local_c78,blo,bhi,g_B,clo,chi);
      bndim = local_cc0;
      pnga_distribution(g_B,local_c68,loB,hiB);
    }
    else {
      bVar10 = false;
    }
    if ((andim != bndim) && (local_cc0 = bndim, andim < bndim)) {
      local_cc0 = andim;
    }
    lVar5 = pnga_comp_patch(andim,loA,hiA,local_cc0,loC,hiC);
    if (lVar5 == 0) {
      pnga_error(" A patch mismatch ",g_A);
    }
    lVar5 = pnga_comp_patch(bndim,loB,hiB,local_cc0,loC,hiC);
    if (lVar5 == 0) {
      pnga_error(" B patch mismatch ",g_B);
    }
    lVar5 = pnga_patch_intersect(clo,chi,loC,hiC,local_cc0);
    if (lVar5 != 0) {
      pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
      pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
      pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
      ngai_do_elem2_oper(atype,local_cc0,loC,hiC,ldC,A_ptr,B_ptr,C_ptr,op);
      pnga_release(g_A,loC,hiC);
      pnga_release(g_B,loC,hiC);
      pnga_release_update(g_c,loC,hiC);
    }
    if ((char)local_c70 != '\0') goto LAB_0010b3d6;
  }
  else {
    lVar5 = pnga_duplicate(g_c,&g_A,"temp");
    if (lVar5 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_c80,alo,ahi,g_A,clo,chi);
    andim = local_cc0;
    lVar5 = pnga_duplicate(g_c,&g_B,"temp");
    if (lVar5 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_c78,blo,bhi,g_B,clo,chi);
    bndim = local_cc0;
    pnga_local_iterator_init(g_A,&hdl_a);
    pnga_local_iterator_init(g_B,&hdl_b);
    pnga_local_iterator_init(g_c,&hdl_c);
    while (iVar1 = pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC), iVar1 != 0) {
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      lVar8 = 0;
      if (0 < local_cc0) {
        lVar8 = local_cc0;
      }
      for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
        lod[lVar7] = (int)loC[lVar7];
      }
      lVar5 = pnga_patch_intersect(clo,chi,loC,hiC,local_cc0);
      if (lVar5 != 0) {
        lVar8 = local_cc0 + -1;
        if (lVar8 < 1) {
          lVar8 = 0;
        }
        lVar2 = 0;
        lVar7 = 1;
        for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
          lVar2 = lVar2 + (loC[lVar9] - (long)lod[lVar9]) * lVar7;
          lVar7 = lVar7 * ldC[lVar9];
        }
        if (ctype - 0x3e9U < 7) {
          lVar2 = (loC[local_cc0 + -1] - (long)lod[local_cc0 + -1]) * lVar7 + lVar2;
          switch(ctype) {
          case 0x3e9:
          case 0x3eb:
            A_ptr = A_ptr + lVar2 * 4;
            lVar2 = lVar2 * 4;
            break;
          default:
            A_ptr = A_ptr + lVar2 * 8;
            lVar2 = lVar2 * 8;
            break;
          case 0x3ed:
            goto switchD_0010af53_caseD_3ed;
          case 0x3ef:
            lVar2 = lVar2 * 0x10;
            A_ptr = A_ptr + lVar2;
          }
          B_ptr = B_ptr + lVar2;
          C_ptr = C_ptr + lVar2;
        }
        else {
switchD_0010af53_caseD_3ed:
        }
        ngai_do_elem2_oper(atype,local_cc0,loC,hiC,ldC,A_ptr,B_ptr,C_ptr,op);
      }
      pnga_release(g_A,loC,hiC);
      pnga_release(g_B,loC,hiC);
      pnga_release_update(g_c,loC,hiC);
    }
    bVar10 = true;
  }
  pnga_destroy(g_A);
LAB_0010b3d6:
  if (bVar10) {
    pnga_destroy(g_B);
  }
  if (local_c5c != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

static void ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,
                              g_c, clo, chi, op)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
int op; /* operation to be perform between g_a and g_b */
{
  Integer i, j;
  Integer compatible;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer idx, n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();
  pnga_check_handle(g_a, "gai_elem2_patch_");

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution(g_A, me, loA, hiA);
    pnga_distribution(g_B, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
        pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      }
      else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
    }

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
        pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!compatible) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);
    }        

    if(andim > bndim) cndim = bndim;
    if(andim < bndim) cndim = andim;

    if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
      pnga_error(" A patch mismatch ", g_A); 
    if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
      pnga_error(" B patch mismatch ", g_B);

    /*  determine subsets of my patches to access  */
    if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
      pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
      pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
      pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

      /* compute "local" operation accoording to op */
      ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC); 
      pnga_release_update(g_c, loC, hiC); 

    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    int lod[MAXDIM];
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

    /* C is normally distributed so just add copies together for regular
       arrays */
#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);

      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
        Integer offset, last, jtot;
        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;
        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC,
            A_ptr, B_ptr, C_ptr, op);
      }
      /* release access to the data */
      pnga_release       (g_A, loC, hiC);
      pnga_release       (g_B, loC, hiC);
      pnga_release_update(g_c, loC, hiC);
    }
#else
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        /* compute "local" operation accoording to op */
        ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC);
        pnga_release_update(g_c, loC, hiC);
      }
    } else {
      Integer lod[MAXDIM];
      /* Integer hid[MAXDIM]; */
      /* Integer chk; */
      Integer offset, last, jtot;
      if (!pnga_uses_proc_grid(g_c)) {
        Integer nproc = pnga_nnodes();
        for (idx = me; idx < num_blocks_c; idx += nproc) {

          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx);
            pnga_release_update_block(g_c, idx);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /* chk = 1; */
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /* if (hiC[i] < loC[i]) chk = 0; */
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /* hid[j] = hiC[j]; */
          }

          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;
            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              default:
                break;
            }

            /* compute "local" operation accoording to op */
            ngai_do_elem2_oper(atype, cndim, loC, hiC, ldC, A_ptr, B_ptr, C_ptr, op);

            /* release access to the data */
            pnga_release_block_grid       (g_A, index);
            pnga_release_block_grid       (g_B, index);
            pnga_release_update_block_grid(g_c, index);
          }
          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}